

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

void ncnn::copy_cut_border_image<signed_char>(Mat *src,Mat *dst,int top,int left)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int x;
  int y;
  char *outptr;
  char *ptr;
  int h;
  int w;
  int local_50;
  int local_4c;
  void *local_48;
  void *local_40;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  iVar2 = *(int *)(in_RSI + 6);
  local_40 = (void *)(*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)in_EDX * in_RDI[2] +
                     (long)in_ECX);
  local_48 = (void *)*in_RSI;
  for (local_4c = 0; local_4c < iVar2; local_4c = local_4c + 1) {
    if (iVar1 < 0xc) {
      for (local_50 = 0; local_50 < iVar1; local_50 = local_50 + 1) {
        *(undefined1 *)((long)local_48 + (long)local_50) =
             *(undefined1 *)((long)local_40 + (long)local_50);
      }
    }
    else {
      memcpy(local_48,local_40,(long)iVar1);
    }
    local_48 = (void *)((long)local_48 + (long)iVar1);
    local_40 = (void *)((long)local_40 + (long)*(int *)((long)in_RDI + 0x2c));
  }
  return;
}

Assistant:

static void copy_cut_border_image(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src.row<T>(top) + left;
    T* outptr = dst; //.data;

    for (int y = 0; y < h; y++)
    {
        if (w < 12)
        {
            for (int x = 0; x < w; x++)
            {
                outptr[x] = ptr[x];
            }
        }
        else
        {
            memcpy(outptr, ptr, w * sizeof(T));
        }
        outptr += w;
        ptr += src.w;
    }
}